

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextLinux.cpp
# Opt level: O1

void __thiscall
Diligent::GLContext::GLContext
          (GLContext *this,EngineGLCreateInfo *InitAttribs,RENDER_DEVICE_TYPE *DevType,
          Version *APIVersion,SwapChainDesc *param_4)

{
  GLenum GVar1;
  long lVar2;
  Version VVar3;
  char *this_00;
  char *in_stack_ffffffffffffff78;
  undefined1 local_7a;
  undefined1 local_79;
  Int32 MinorVersion;
  Int32 MajorVersion;
  RENDER_DEVICE_TYPE *local_70;
  Version *local_68;
  string _msg;
  GLubyte *GLRenderer;
  GLubyte *GLVersionString;
  
  this->m_WindowId = *(Uint32 *)(InitAttribs + 0x78);
  this->m_pDisplay = *(void **)(InitAttribs + 0x80);
  local_70 = DevType;
  local_68 = APIVersion;
  lVar2 = glXGetCurrentContext();
  if (lVar2 == 0) {
    LogError<true,char[29]>
              (false,"GLContext",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextLinux.cpp"
               ,0x2f,(char (*) [29])"No current GL context found!");
  }
  GVar1 = glewInit();
  if (GVar1 != 0) {
    LogError<true,char[26]>
              (false,"GLContext",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextLinux.cpp"
               ,0x35,(char (*) [26])"Failed to initialize GLEW");
  }
  GLVersionString = (GLubyte *)glGetString(0x1f02);
  GLRenderer = (GLubyte *)glGetString(0x1f01);
  MajorVersion = 0;
  MinorVersion = 0;
  glGetIntegerv(0x821b,(char (*) [20])&MajorVersion);
  glGetIntegerv(0x821c,&MinorVersion);
  this_00 = "Initialized OpenGL ";
  if (*(int *)(InitAttribs + 0x78) == 0) {
    this_00 = "Attached to OpenGL ";
  }
  local_79 = 0x2e;
  local_7a = 0x29;
  FormatString<char[20],int,char,int,char[11],unsigned_char_const*,char[3],unsigned_char_const*,char>
            (&_msg,(Diligent *)this_00,(char (*) [20])&MajorVersion,(int *)&local_79,
             (char *)&MinorVersion,(int *)" context (",(char (*) [11])&GLVersionString,
             (uchar **)0x361121,(char (*) [3])&GLRenderer,(uchar **)&local_7a,
             in_stack_ffffffffffffff78);
  if (DebugMessageCallback != (undefined *)0x0) {
    (*(code *)DebugMessageCallback)(0,_msg._M_dataplus._M_p,0,0,0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_msg._M_dataplus._M_p != &_msg.field_2) {
    operator_delete(_msg._M_dataplus._M_p,_msg.field_2._M_allocated_capacity + 1);
  }
  *local_70 = RENDER_DEVICE_TYPE_GL;
  VVar3.Minor = MinorVersion;
  VVar3.Major = MajorVersion;
  *local_68 = VVar3;
  return;
}

Assistant:

GLContext::GLContext(const EngineGLCreateInfo& InitAttribs,
                     RENDER_DEVICE_TYPE&       DevType,
                     struct Version&           APIVersion,
                     const struct SwapChainDesc* /*pSCDesc*/) :
    m_WindowId(InitAttribs.Window.WindowId),
    m_pDisplay(InitAttribs.Window.pDisplay)
{
    auto CurrentCtx = glXGetCurrentContext();
    if (CurrentCtx == 0)
    {
        LOG_ERROR_AND_THROW("No current GL context found!");
    }

    // Initialize GLEW
    GLenum err = glewInit();
    if (GLEW_OK != err)
        LOG_ERROR_AND_THROW("Failed to initialize GLEW");

    //Checking GL version
    const GLubyte* GLVersionString = glGetString(GL_VERSION);
    const GLubyte* GLRenderer      = glGetString(GL_RENDERER);

    Int32 MajorVersion = 0, MinorVersion = 0;
    //Or better yet, use the GL3 way to get the version number
    glGetIntegerv(GL_MAJOR_VERSION, &MajorVersion);
    glGetIntegerv(GL_MINOR_VERSION, &MinorVersion);
    LOG_INFO_MESSAGE(InitAttribs.Window.WindowId != 0 ? "Initialized OpenGL " : "Attached to OpenGL ", MajorVersion, '.', MinorVersion, " context (", GLVersionString, ", ", GLRenderer, ')');

    DevType    = RENDER_DEVICE_TYPE_GL;
    APIVersion = Version{static_cast<Uint32>(MajorVersion), static_cast<Uint32>(MinorVersion)};
}